

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  VarType *pVVar1;
  DataType DVar2;
  Context *pCVar3;
  bool bVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  TestNode *pTVar6;
  char *pcVar7;
  char *pcVar8;
  Block2LevelStructArrayCase *pBVar9;
  TestCaseGroup *randomGroup;
  deUint32 allFeatures;
  deUint32 basicTypeArrays;
  deUint32 matFlags;
  deUint32 unused;
  deUint32 allBasicTypes;
  deUint32 allLayouts;
  deUint32 allShaders;
  undefined1 local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined4 local_254;
  deUint32 local_250;
  allocator<char> local_249;
  deUint32 baseFlags;
  string baseName;
  int isArray;
  int layoutFlagNdx_2;
  TestCaseGroup *modeGroup;
  int modeNdx;
  TestCaseGroup *structArrayArrayGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  int local_19c;
  undefined1 local_198 [4];
  int matFlagNdx_1;
  VarType parentType_1;
  VarType childType1;
  undefined1 local_150 [8];
  VarType childType0;
  int parentSize_1;
  int childSize1;
  int childSize0;
  char *typeName_1;
  DataType type_1;
  int basicTypeNdx_1;
  TestCaseGroup *layoutGroup_1;
  int layoutFlagNdx_1;
  TestCaseGroup *nestedArrayGroup_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  int local_94;
  undefined1 local_90 [4];
  int matFlagNdx;
  VarType parentType;
  undefined1 local_60 [8];
  VarType childType;
  int parentSize;
  int childSize;
  char *typeName;
  DataType type;
  int basicTypeNdx;
  TestCaseGroup *layoutGroup;
  int layoutFlagNdx;
  TestCaseGroup *nestedArrayGroup;
  UniformBlockTests *this_local;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "2_level_array","2-level basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (layoutGroup._0_4_ = 0; (int)layoutGroup < 3; layoutGroup._0_4_ = (int)layoutGroup + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[(int)layoutGroup].name,"");
    tcu::TestNode::addChild(pTVar5,pTVar6);
    for (typeName._4_4_ = 0; typeName._4_4_ < 0x19; typeName._4_4_ = typeName._4_4_ + 1) {
      DVar2 = init::basicTypes[typeName._4_4_];
      pcVar7 = glu::getDataTypeName(DVar2);
      childType.m_data._12_4_ = 4;
      childType.m_data.array.size = 3;
      bVar4 = glu::isDataTypeBoolOrBVec(DVar2);
      pVVar1 = (VarType *)((long)&parentType.m_data + 8);
      deqp::gls::ub::VarType::VarType(pVVar1,DVar2,(uint)!bVar4 << 2);
      deqp::gls::ub::VarType::VarType((VarType *)local_60,pVVar1,4);
      deqp::gls::ub::VarType::~VarType((VarType *)((long)&parentType.m_data + 8));
      deqp::gls::ub::VarType::VarType((VarType *)local_90,(VarType *)local_60,3);
      anon_unknown_1::createBlockBasicTypeCases
                ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).m_context,pcVar7,
                 (VarType *)local_90,init::layoutFlags[(int)layoutGroup].flags,0);
      bVar4 = glu::isDataTypeMatrix(DVar2);
      if (bVar4) {
        for (local_94 = 0; local_94 < 2; local_94 = local_94 + 1) {
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar8 = init::matrixFlags[local_94].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,pcVar8,(allocator<char> *)((long)&nestedArrayGroup_1 + 7));
          std::operator+(&local_d8,&local_f8,"_");
          std::operator+(&local_b8,&local_d8,pcVar7);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::createBlockBasicTypeCases
                    ((TestCaseGroup *)pTVar6,pCVar3,pcVar8,(VarType *)local_90,
                     init::layoutFlags[(int)layoutGroup].flags | init::matrixFlags[local_94].flags,0
                    );
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&nestedArrayGroup_1 + 7));
        }
      }
      deqp::gls::ub::VarType::~VarType((VarType *)local_90);
      deqp::gls::ub::VarType::~VarType((VarType *)local_60);
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "3_level_array","3-level basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (layoutGroup_1._4_4_ = 0; layoutGroup_1._4_4_ < 3;
      layoutGroup_1._4_4_ = layoutGroup_1._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[layoutGroup_1._4_4_].name,"");
    tcu::TestNode::addChild(pTVar5,pTVar6);
    for (typeName_1._4_4_ = 0; typeName_1._4_4_ < 0x19; typeName_1._4_4_ = typeName_1._4_4_ + 1) {
      DVar2 = init::basicTypes[typeName_1._4_4_];
      pcVar7 = glu::getDataTypeName(DVar2);
      childType0.m_data._12_4_ = 3;
      bVar4 = glu::isDataTypeBoolOrBVec(DVar2);
      pVVar1 = (VarType *)((long)&childType1.m_data + 8);
      deqp::gls::ub::VarType::VarType(pVVar1,DVar2,(uint)!bVar4 << 2);
      deqp::gls::ub::VarType::VarType((VarType *)local_150,pVVar1,2);
      deqp::gls::ub::VarType::~VarType((VarType *)((long)&childType1.m_data + 8));
      deqp::gls::ub::VarType::VarType
                ((VarType *)((long)&parentType_1.m_data + 8),(VarType *)local_150,4);
      deqp::gls::ub::VarType::VarType
                ((VarType *)local_198,(VarType *)((long)&parentType_1.m_data + 8),3);
      anon_unknown_1::createBlockBasicTypeCases
                ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).m_context,pcVar7,
                 (VarType *)local_198,init::layoutFlags[layoutGroup_1._4_4_].flags,0);
      bVar4 = glu::isDataTypeMatrix(DVar2);
      if (bVar4) {
        for (local_19c = 0; local_19c < 2; local_19c = local_19c + 1) {
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar8 = init::matrixFlags[local_19c].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200,pcVar8,
                     (allocator<char> *)((long)&structArrayArrayGroup + 7));
          std::operator+(&local_1e0,&local_200,"_");
          std::operator+(&local_1c0,&local_1e0,pcVar7);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::createBlockBasicTypeCases
                    ((TestCaseGroup *)pTVar6,pCVar3,pcVar8,(VarType *)local_198,
                     init::layoutFlags[layoutGroup_1._4_4_].flags |
                     init::matrixFlags[local_19c].flags,0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator((allocator<char> *)((long)&structArrayArrayGroup + 7));
        }
      }
      deqp::gls::ub::VarType::~VarType((VarType *)local_198);
      deqp::gls::ub::VarType::~VarType((VarType *)((long)&parentType_1.m_data + 8));
      deqp::gls::ub::VarType::~VarType((VarType *)local_150);
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "2_level_struct_array","Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (modeGroup._4_4_ = 0; modeGroup._4_4_ < 2; modeGroup._4_4_ = modeGroup._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup._4_4_].name,"");
    tcu::TestNode::addChild(pTVar5,pTVar6);
    for (baseName.field_2._12_4_ = 0; (int)baseName.field_2._12_4_ < 3;
        baseName.field_2._12_4_ = baseName.field_2._12_4_ + 1) {
      for (baseName.field_2._8_4_ = 0; (int)baseName.field_2._8_4_ < 2;
          baseName.field_2._8_4_ = baseName.field_2._8_4_ + 1) {
        pcVar7 = init::layoutFlags[(int)baseName.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags,pcVar7,&local_249);
        std::allocator<char>::~allocator(&local_249);
        local_250 = init::layoutFlags[(int)baseName.field_2._12_4_].flags;
        if ((init::bufferModes[modeGroup._4_4_].mode == BUFFERMODE_SINGLE) &&
           (baseName.field_2._8_4_ == 0)) {
          local_254 = 0x1c;
        }
        else {
          if (baseName.field_2._8_4_ != 0) {
            std::__cxx11::string::operator+=((string *)&baseFlags,"_instance_array");
          }
          pBVar9 = (Block2LevelStructArrayCase *)operator_new(0xb8);
          local_279 = 1;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags,"_vertex");
          pcVar7 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::Block2LevelStructArrayCase::Block2LevelStructArrayCase
                    (pBVar9,pCVar3,pcVar7,"",local_250 | 0x100,
                     init::bufferModes[modeGroup._4_4_].mode,
                     (uint)(baseName.field_2._8_4_ != 0) + (uint)(baseName.field_2._8_4_ != 0) * 2);
          local_279 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar9);
          std::__cxx11::string::~string((string *)&local_278);
          pBVar9 = (Block2LevelStructArrayCase *)operator_new(0xb8);
          local_2a1 = 1;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags,"_fragment");
          pcVar7 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::Block2LevelStructArrayCase::Block2LevelStructArrayCase
                    (pBVar9,pCVar3,pcVar7,"",local_250 | 0x200,
                     init::bufferModes[modeGroup._4_4_].mode,
                     (uint)(baseName.field_2._8_4_ != 0) + (uint)(baseName.field_2._8_4_ != 0) * 2);
          local_2a1 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar9);
          std::__cxx11::string::~string((string *)&local_2a0);
          if ((local_250 & 0x10) == 0) {
            pBVar9 = (Block2LevelStructArrayCase *)operator_new(0xb8);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &allShaders,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &baseFlags,"_both");
            pcVar7 = (char *)std::__cxx11::string::c_str();
            anon_unknown_1::Block2LevelStructArrayCase::Block2LevelStructArrayCase
                      (pBVar9,pCVar3,pcVar7,"",local_250 | 0x300,
                       init::bufferModes[modeGroup._4_4_].mode,
                       (uint)(baseName.field_2._8_4_ != 0) + (uint)(baseName.field_2._8_4_ != 0) * 2
                      );
            tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar9);
            std::__cxx11::string::~string((string *)&allShaders);
          }
          local_254 = 0;
        }
        std::__cxx11::string::~string((string *)&baseFlags);
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"basic_type_arrays",
             "Arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0xffc7,0x19,0x47e);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",BUFFERMODE_PER_BLOCK,0xffffffff,0x32,0x2bc0);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",BUFFERMODE_SINGLE,0xffffffff,0x32,0x2bf2);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init (void)
{
	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4,
		glu::TYPE_BOOL,
		glu::TYPE_BOOL_VEC2,
		glu::TYPE_BOOL_VEC3,
		glu::TYPE_BOOL_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} layoutFlags[] =
	{
		{ "shared",		LAYOUT_SHARED	},
		{ "packed",		LAYOUT_PACKED	},
		{ "std140",		LAYOUT_STD140	}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} matrixFlags[] =
	{
		{ "row_major",		LAYOUT_ROW_MAJOR	},
		{ "column_major",	LAYOUT_COLUMN_MAJOR }
	};

	static const struct
	{
		const char*							name;
		UniformBlockCase::BufferMode		mode;
	} bufferModes[] =
	{
		{ "per_block_buffer",	UniformBlockCase::BUFFERMODE_PER_BLOCK },
		{ "single_buffer",		UniformBlockCase::BUFFERMODE_SINGLE	}
	};

	// ubo.2_level_array
	{
		tcu::TestCaseGroup* nestedArrayGroup = new tcu::TestCaseGroup(m_testCtx, "2_level_array", "2-level basic array variable in single buffer");
		addChild(nestedArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			nestedArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				const glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*			typeName	= glu::getDataTypeName(type);
				const int			childSize	= 4;
				const int			parentSize	= 3;
				const VarType		childType	(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), childSize);
				const VarType		parentType	(childType, parentSize);

				createBlockBasicTypeCases(layoutGroup, m_context, typeName, parentType, layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  parentType, layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.3_level_array
	{
		tcu::TestCaseGroup* nestedArrayGroup = new tcu::TestCaseGroup(m_testCtx, "3_level_array", "3-level basic array variable in single buffer");
		addChild(nestedArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			nestedArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				const glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*			typeName	= glu::getDataTypeName(type);
				const int			childSize0	= 2;
				const int			childSize1	= 4;
				const int			parentSize	= 3;
				const VarType		childType0	(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), childSize0);
				const VarType		childType1	(childType0, childSize1);
				const VarType		parentType	(childType1, parentSize);

				createBlockBasicTypeCases(layoutGroup, m_context, typeName, parentType, layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  parentType, layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.2_level_struct_array
	{
		tcu::TestCaseGroup* structArrayArrayGroup = new tcu::TestCaseGroup(m_testCtx, "2_level_struct_array", "Struct array in one uniform block");
		addChild(structArrayArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			structArrayArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_both").c_str(),	"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32	allShaders		= FEATURE_VERTEX_BLOCKS|FEATURE_FRAGMENT_BLOCKS|FEATURE_SHARED_BLOCKS;
		const deUint32	allLayouts		= FEATURE_PACKED_LAYOUT|FEATURE_SHARED_LAYOUT|FEATURE_STD140_LAYOUT;
		const deUint32	allBasicTypes	= FEATURE_VECTORS|FEATURE_MATRICES;
		const deUint32	unused			= FEATURE_UNUSED_MEMBERS|FEATURE_UNUSED_UNIFORMS;
		const deUint32	matFlags		= FEATURE_MATRIX_LAYOUT;
		const deUint32	basicTypeArrays	= allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_ARRAYS|FEATURE_ARRAYS_OF_ARRAYS;
		const deUint32	allFeatures		= ~0u;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		createRandomCaseGroup(randomGroup, m_context, "basic_type_arrays",		"Arrays, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	basicTypeArrays,	25, 1150);
		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers",	"All random features, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allFeatures,		50, 11200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer",		"All random features, shared buffer",		UniformBlockCase::BUFFERMODE_SINGLE,	allFeatures,		50, 11250);
	}
}